

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O3

wchar_t set_xattrs(archive_write_disk *a)

{
  wchar_t wVar1;
  wchar_t wVar2;
  
  wVar1 = archive_entry_xattr_count(a->entry);
  wVar2 = L'\0';
  if ((wVar1 != L'\0') && ((set_xattrs_warning_done & 1) == 0)) {
    set_xattrs_warning_done = 1;
    archive_set_error(&a->archive,0x54,"Cannot restore extended attributes on this system");
    wVar2 = L'\xffffffec';
  }
  return wVar2;
}

Assistant:

static int
set_xattrs(struct archive_write_disk *a)
{
	static int warning_done = 0;

	/* If there aren't any extended attributes, then it's okay not
	 * to extract them, otherwise, issue a single warning. */
	if (archive_entry_xattr_count(a->entry) != 0 && !warning_done) {
		warning_done = 1;
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Cannot restore extended attributes on this system");
		return (ARCHIVE_WARN);
	}
	/* Warning was already emitted; suppress further warnings. */
	return (ARCHIVE_OK);
}